

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

void __thiscall re2::Compiler::AddRuneRangeUTF8(Compiler *this,Rune lo,Rune hi,bool foldcase)

{
  uint uVar1;
  PatchList PVar2;
  int next;
  Frag FVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  bool bVar11;
  uint8_t uhi [4];
  uint8_t ulo [4];
  undefined4 local_38;
  uint8_t local_34 [3];
  byte bStack_31;
  uint8_t local_30 [4];
  uint local_2c;
  
  while( true ) {
    if (hi < lo) {
      return;
    }
    local_38 = hi;
    local_2c = lo;
    if ((hi == 0x10ffff && lo == 0x80) && (this->reversed_ == false)) {
      Add_80_10ffff(this);
      return;
    }
    if ((0x7f < lo) || (hi < 0x80)) break;
    AddRuneRangeUTF8(this,lo,0x7f,foldcase);
    lo = 0x80;
    hi = local_38;
  }
  uVar9 = 0;
  bVar4 = 10;
  do {
    if (uVar9 == 2) goto LAB_001b25fb;
    uVar6 = -2 << (bVar4 & 0x1f);
    uVar1 = ~uVar6;
    uVar9 = uVar9 + 1;
    bVar4 = bVar4 + 5;
  } while (hi <= (int)uVar1 || (int)uVar1 < lo);
  AddRuneRangeUTF8(this,lo,uVar1,foldcase);
  AddRuneRangeUTF8(this,-uVar6,local_38,foldcase);
  if (uVar9 < 3) {
    return;
  }
LAB_001b25fb:
  if ((int)local_38 < 0x80) {
    FVar3 = ByteRange(this,local_2c & 0xff,local_38 & 0xff,foldcase);
    PVar2 = PatchList::Append((this->inst_).ptr_._M_t.
                              super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                              .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl,
                              (this->rune_range_).end.p,FVar3.end.p);
    (this->rune_range_).end.p = PVar2.p;
    AddSuffix(this,FVar3.begin);
    return;
  }
  uVar9 = 1;
  bVar4 = 6;
  bVar11 = false;
  do {
    uVar1 = -1 << (bVar4 & 0x1f);
    if ((local_2c & uVar1) != (uVar1 & local_38)) {
      uVar6 = ~uVar1;
      if ((local_2c & uVar6) == 0) {
        if ((uVar1 | local_38) == 0xffffffff) goto LAB_001b26a4;
        AddRuneRangeUTF8(this,local_2c,(uVar1 & local_38) - 1,foldcase);
        uVar1 = uVar1 & local_38;
      }
      else {
        AddRuneRangeUTF8(this,local_2c,local_2c | uVar6,foldcase);
        uVar1 = (uVar6 | local_2c) + 1;
      }
      AddRuneRangeUTF8(this,uVar1,local_38,foldcase);
      if (!bVar11) {
        return;
      }
      break;
    }
LAB_001b26a4:
    bVar11 = 2 < uVar9;
    uVar9 = uVar9 + 1;
    bVar4 = bVar4 + 6;
  } while (uVar9 != 4);
  uVar9 = runetochar((char *)(local_34 + 4),(Rune *)&local_2c);
  runetochar((char *)local_34,&local_38);
  if (this->reversed_ == true) {
    if (0 < (int)uVar9) {
      uVar5 = 0;
      next = 0;
      do {
        if (uVar5 == 0) {
LAB_001b2777:
          next = CachedRuneByteSuffix(this,local_34[uVar5 + 4],local_34[uVar5],false,next);
        }
        else {
          if (uVar9 - 1 != uVar5 && local_34[uVar5 + 4] == local_34[uVar5]) goto LAB_001b2777;
          next = UncachedRuneByteSuffix(this,local_34[uVar5 + 4],local_34[uVar5],false,next);
        }
        uVar5 = uVar5 + 1;
      } while (uVar9 != uVar5);
      goto LAB_001b2806;
    }
  }
  else if (0 < (int)uVar9) {
    lVar10 = 0;
    next = 0;
    lVar7 = (ulong)(uVar9 - 1) + 1;
    do {
      if (lVar10 == 0) {
LAB_001b27cc:
        next = CachedRuneByteSuffix(this,local_34[lVar7 + 3],local_34[lVar7 + -1],false,next);
      }
      else {
        if (lVar7 != 1 && local_34[lVar7 + 3] < local_34[lVar7 + -1]) goto LAB_001b27cc;
        next = UncachedRuneByteSuffix(this,local_34[lVar7 + 3],local_34[lVar7 + -1],false,next);
      }
      lVar10 = lVar10 + 1;
      lVar8 = lVar7 + -1;
      bVar11 = 0 < lVar7;
      lVar7 = lVar8;
    } while (lVar8 != 0 && bVar11);
    goto LAB_001b2806;
  }
  next = 0;
LAB_001b2806:
  AddSuffix(this,next);
  return;
}

Assistant:

void Compiler::AddRuneRangeUTF8(Rune lo, Rune hi, bool foldcase) {
  if (lo > hi)
    return;

  // Pick off 80-10FFFF as a common special case
  // that can bypass the slow rune_cache_.
  if (lo == 0x80 && hi == 0x10ffff && !reversed_) {
    Add_80_10ffff();
    return;
  }

  // Split range into same-length sized ranges.
  for (int i = 1; i < UTFmax; i++) {
    Rune max = MaxRune(i);
    if (lo <= max && max < hi) {
      AddRuneRangeUTF8(lo, max, foldcase);
      AddRuneRangeUTF8(max+1, hi, foldcase);
      return;
    }
  }

  // ASCII range is always a special case.
  if (hi < Runeself) {
    AddSuffix(UncachedRuneByteSuffix(static_cast<uint8_t>(lo),
                                     static_cast<uint8_t>(hi), foldcase, 0));
    return;
  }

  // Split range into sections that agree on leading bytes.
  for (int i = 1; i < UTFmax; i++) {
    uint32_t m = (1<<(6*i)) - 1;  // last i bytes of a UTF-8 sequence
    if ((lo & ~m) != (hi & ~m)) {
      if ((lo & m) != 0) {
        AddRuneRangeUTF8(lo, lo|m, foldcase);
        AddRuneRangeUTF8((lo|m)+1, hi, foldcase);
        return;
      }
      if ((hi & m) != m) {
        AddRuneRangeUTF8(lo, (hi&~m)-1, foldcase);
        AddRuneRangeUTF8(hi&~m, hi, foldcase);
        return;
      }
    }
  }

  // Finally.  Generate byte matching equivalent for lo-hi.
  uint8_t ulo[UTFmax], uhi[UTFmax];
  int n = runetochar(reinterpret_cast<char*>(ulo), &lo);
  int m = runetochar(reinterpret_cast<char*>(uhi), &hi);
  (void)m;  // USED(m)
  DCHECK_EQ(n, m);

  // The logic below encodes this thinking:
  //
  // 1. When we have built the whole suffix, we know that it cannot
  // possibly be a suffix of anything longer: in forward mode, nothing
  // else can occur before the leading byte; in reverse mode, nothing
  // else can occur after the last continuation byte or else the leading
  // byte would have to change. Thus, there is no benefit to caching
  // the first byte of the suffix whereas there is a cost involved in
  // cloning it if it begins a common prefix, which is fairly likely.
  //
  // 2. Conversely, the last byte of the suffix cannot possibly be a
  // prefix of anything because next == 0, so we will never want to
  // clone it, but it is fairly likely to be a common suffix. Perhaps
  // more so in reverse mode than in forward mode because the former is
  // "converging" towards lower entropy, but caching is still worthwhile
  // for the latter in cases such as 80-BF.
  //
  // 3. Handling the bytes between the first and the last is less
  // straightforward and, again, the approach depends on whether we are
  // "converging" towards lower entropy: in forward mode, a single byte
  // is unlikely to be part of a common suffix whereas a byte range
  // is more likely so; in reverse mode, a byte range is unlikely to
  // be part of a common suffix whereas a single byte is more likely
  // so. The same benefit versus cost argument applies here.
  int id = 0;
  if (reversed_) {
    for (int i = 0; i < n; i++) {
      // In reverse UTF-8 mode: cache the leading byte; don't cache the last
      // continuation byte; cache anything else iff it's a single byte (XX-XX).
      if (i == 0 || (ulo[i] == uhi[i] && i != n-1))
        id = CachedRuneByteSuffix(ulo[i], uhi[i], false, id);
      else
        id = UncachedRuneByteSuffix(ulo[i], uhi[i], false, id);
    }
  } else {
    for (int i = n-1; i >= 0; i--) {
      // In forward UTF-8 mode: don't cache the leading byte; cache the last
      // continuation byte; cache anything else iff it's a byte range (XX-YY).
      if (i == n-1 || (ulo[i] < uhi[i] && i != 0))
        id = CachedRuneByteSuffix(ulo[i], uhi[i], false, id);
      else
        id = UncachedRuneByteSuffix(ulo[i], uhi[i], false, id);
    }
  }
  AddSuffix(id);
}